

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellUtility.cpp
# Opt level: O0

void __thiscall
llbuild::basic::appendShellEscapedString(basic *this,raw_ostream *os,StringRef string)

{
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  size_type From;
  raw_ostream *prVar4;
  unsigned_long *puVar5;
  char *local_128;
  size_t idx;
  StringRef local_f8;
  size_t singleQuotePos;
  string local_d8 [8];
  string escQuote;
  StringRef local_a8;
  size_t pos;
  raw_ostream *local_88;
  raw_ostream *os_local;
  StringRef string_local;
  char *local_50;
  unsigned_long local_48;
  raw_ostream **local_40;
  undefined1 local_38 [16];
  raw_ostream **local_28;
  size_t local_20;
  char *local_18;
  undefined1 *local_10;
  
  string_local.Data = string.Data;
  local_88 = (raw_ostream *)this;
  os_local = os;
  if ((appendShellEscapedString(llvm::raw_ostream&,llvm::StringRef)::whitelist_abi_cxx11_ == '\0')
     && (iVar2 = __cxa_guard_acquire(&appendShellEscapedString(llvm::raw_ostream&,llvm::StringRef)::
                                      whitelist_abi_cxx11_,os,string_local.Data,string.Length),
        iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &appendShellEscapedString(llvm::raw_ostream&,llvm::StringRef)::whitelist_abi_cxx11_,
               "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ1234567890-_/:@#%+=.,",
               (allocator *)((long)&pos + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
    __cxa_atexit(std::__cxx11::string::~string,
                 &appendShellEscapedString(llvm::raw_ostream&,llvm::StringRef)::whitelist_abi_cxx11_
                 ,&__dso_handle);
    __cxa_guard_release(&appendShellEscapedString(llvm::raw_ostream&,llvm::StringRef)::
                         whitelist_abi_cxx11_);
  }
  string_local.Length =
       (size_t)&appendShellEscapedString(llvm::raw_ostream&,llvm::StringRef)::whitelist_abi_cxx11_;
  uVar3 = std::__cxx11::string::data();
  local_a8.Data = (char *)uVar3;
  uVar3 = std::__cxx11::string::length();
  local_a8.Length = uVar3;
  From = llvm::StringRef::find_first_not_of((StringRef *)&os_local,local_a8,0);
  if (From == 0xffffffffffffffff) {
    escQuote.field_2._8_8_ = os_local;
    Str_01.Length = (size_t)string_local.Data;
    Str_01.Data = (char *)os_local;
    llvm::raw_ostream::operator<<(local_88,Str_01);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"\'",(allocator *)((long)&singleQuotePos + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&singleQuotePos + 7));
    strlen("\'");
    local_128 = (char *)llvm::StringRef::find_first_of((StringRef *)&os_local,local_f8,From);
    if (local_128 == (char *)0xffffffffffffffff) {
      prVar4 = llvm::raw_ostream::operator<<(local_88,"\'");
      Str_00.Length = (size_t)string_local.Data;
      Str_00.Data = (char *)os_local;
      prVar4 = llvm::raw_ostream::operator<<(prVar4,Str_00);
      llvm::raw_ostream::operator<<(prVar4,"\'");
    }
    else {
      llvm::raw_ostream::operator<<(local_88,"\'");
      prVar4 = local_88;
      local_40 = &os_local;
      local_48 = 0;
      local_50 = local_128;
      puVar5 = std::min<unsigned_long>(&local_48,(unsigned_long *)&string_local);
      local_48 = *puVar5;
      puVar5 = std::max<unsigned_long>(&local_48,(unsigned_long *)&local_50);
      puVar5 = std::min<unsigned_long>(puVar5,(unsigned_long *)&string_local);
      local_50 = (char *)*puVar5;
      local_18 = (char *)((long)&os_local->_vptr_raw_ostream + local_48);
      local_20 = (long)local_50 - local_48;
      local_10 = local_38;
      Str.Length = local_20;
      Str.Data = local_18;
      llvm::raw_ostream::operator<<(prVar4,Str);
      for (; local_28 = &os_local, local_128 < string_local.Data; local_128 = local_128 + 1) {
        cVar1 = llvm::StringRef::operator[]((StringRef *)&os_local,(size_t)local_128);
        prVar4 = local_88;
        if (cVar1 == '\'') {
          llvm::raw_ostream::operator<<(local_88,"\'\\\'\'");
        }
        else {
          cVar1 = llvm::StringRef::operator[]((StringRef *)&os_local,(size_t)local_128);
          llvm::raw_ostream::operator<<(prVar4,cVar1);
        }
      }
      llvm::raw_ostream::operator<<(local_88,"\'");
    }
    std::__cxx11::string::~string(local_d8);
  }
  return;
}

Assistant:

void appendShellEscapedString(llvm::raw_ostream& os, StringRef string) {
#if defined(_WIN32)
  os << formatWindowsCommandArg(string);
  return;
#else
  static const std::string whitelist = "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ1234567890-_/:@#%+=.,";
  auto pos = string.find_first_not_of(whitelist);

  // We don't need any escaping just append the string and return.
  if (pos == std::string::npos) {
    os << string;
    return;
  }

  std::string escQuote = "'";
  // We only need to escape the single quote, if it isn't present we can
  // escape using single quotes.
  auto singleQuotePos = string.find_first_of("'" , pos);
  if (singleQuotePos == std::string::npos) {
    os << "'" << string << "'";
    return;
  }

  // Otherwise iterate and escape all the single quotes.
  os << "'";
  os << string.slice(0, singleQuotePos);
  for (auto idx = singleQuotePos; idx < string.size(); idx++) {
    if (string[idx] == '\'') {
      os << "'\\''";
    } else {
      os << string[idx];
    }
  }
  os << "'";
#endif
}